

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::translate(btSoftBody *this,btVector3 *trs)

{
  btTransform t;
  btTransform local_40;
  
  local_40.m_basis.m_el[0].m_floats[0] = 1.0;
  local_40.m_basis.m_el[0].m_floats[1] = 0.0;
  local_40.m_basis.m_el[0].m_floats[2] = 0.0;
  local_40.m_basis.m_el[0].m_floats[3] = 0.0;
  local_40.m_basis.m_el[1].m_floats[0] = 0.0;
  local_40.m_basis.m_el[1].m_floats[1] = 1.0;
  local_40.m_basis.m_el[1].m_floats[2] = 0.0;
  local_40.m_basis.m_el[1].m_floats[3] = 0.0;
  local_40.m_basis.m_el[2].m_floats[0] = 0.0;
  local_40.m_basis.m_el[2].m_floats[1] = 0.0;
  local_40.m_basis.m_el[2].m_floats[2] = 1.0;
  local_40.m_basis.m_el[2].m_floats[3] = 0.0;
  local_40.m_origin.m_floats._0_8_ = *(undefined8 *)trs->m_floats;
  local_40.m_origin.m_floats._8_8_ = *(undefined8 *)(trs->m_floats + 2);
  transform(this,&local_40);
  return;
}

Assistant:

void			btSoftBody::translate(const btVector3& trs)
{
	btTransform	t;
	t.setIdentity();
	t.setOrigin(trs);
	transform(t);
}